

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O1

void __thiscall
LinkedListPool<depspawn::internal::Workitem,_true,_false>::allocate
          (LinkedListPool<depspawn::internal::Workitem,_true,_false> *this)

{
  pointer *pppWVar1;
  __atomic_flag_data_type _Var2;
  int iVar3;
  int iVar4;
  iterator __position;
  Workitem *pWVar5;
  Workitem *pWVar6;
  Workitem *pWVar7;
  bool bVar8;
  Workitem *h;
  Workitem *local_28;
  
  iVar3 = this->chunkSize_;
  iVar4 = this->minTSize_;
  local_28 = (Workitem *)malloc((long)(iVar4 * iVar3));
  pWVar7 = (Workitem *)((long)&local_28->_vptr_Workitem + (long)((iVar3 + -1) * iVar4));
  pWVar5 = local_28;
  do {
    pWVar6 = (Workitem *)((long)&pWVar5->_vptr_Workitem + (long)iVar4);
    pWVar5->_vptr_Workitem = (_func_int **)&PTR__Workitem_00112920;
    (pWVar5->deps_mutex_).super___atomic_flag_base._M_i = false;
    pWVar5->next = pWVar6;
    pWVar5 = pWVar6;
  } while (pWVar6 <= pWVar7);
  do {
    LOCK();
    _Var2 = (this->pool_mutex_).super___atomic_flag_base._M_i;
    (this->pool_mutex_).super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var2 != false);
  __position._M_current =
       (this->v_).
       super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->v_).
      super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<depspawn::internal::Workitem*,std::allocator<depspawn::internal::Workitem*>>::
    _M_realloc_insert<depspawn::internal::Workitem*const&>
              ((vector<depspawn::internal::Workitem*,std::allocator<depspawn::internal::Workitem*>>
                *)this,__position,&local_28);
  }
  else {
    *__position._M_current = local_28;
    pppWVar1 = &(this->v_).
                super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppWVar1 = *pppWVar1 + 1;
  }
  pWVar5 = (this->head_)._M_b._M_p;
  do {
    pWVar7->next = pWVar5;
    LOCK();
    pWVar6 = (this->head_)._M_b._M_p;
    bVar8 = pWVar5 == pWVar6;
    if (bVar8) {
      (this->head_)._M_b._M_p =
           (__pointer_type)
           (((ulong)pWVar5 & 0xffff000000000000) + 0x1000000000000 | (ulong)local_28);
      pWVar6 = pWVar5;
    }
    UNLOCK();
    pWVar5 = pWVar6;
  } while (!bVar8);
  (this->pool_mutex_).super___atomic_flag_base._M_i = false;
  return;
}

Assistant:

void allocate() {
    char * baseptr = PoolAllocator_malloc_free<SCALABLE>::malloc(chunkSize_ * minTSize_);
    char * const endptr = baseptr +  minTSize_ * (chunkSize_ - 1);
    T * const h = reinterpret_cast<T *>(baseptr);
    T * const q = reinterpret_cast<T *>(endptr);
    T * p = h;
    do {
      baseptr += minTSize_;
      if (ALLOC_ONCE) {
        new (p) T();
      }
      p->next = reinterpret_cast<T *>(baseptr); //invalid for p=q. Will be corrected during linking
      p = static_cast<T *>(p->next);
    } while (baseptr <= endptr);
    
    while (pool_mutex_.test_and_set(std::memory_order_acquire));
    
    v_.push_back(h);

    freeLinkedList(h, q, true);
    
    pool_mutex_.clear(std::memory_order_release);
  }